

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.cpp
# Opt level: O1

void __thiscall
embree::TutorialApplication::keyboardFunc
          (TutorialApplication *this,GLFWwindow *window_in,int key,int scancode,int action,int mods)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  Col4<unsigned_char> *color;
  ImGuiIO *pIVar4;
  GLFWwindow *window;
  ImageT<embree::Col4<unsigned_char>_> *this_00;
  ostream *poVar5;
  int iVar6;
  TutorialApplication *pTVar7;
  float fVar8;
  Ref<embree::Image> image;
  Ref<embree::Image> local_58;
  string local_50;
  
  ImGui_ImplGlfw_KeyCallback(window_in,key,scancode,action,mods);
  pIVar4 = ImGui::GetIO();
  if (pIVar4->WantCaptureKeyboard != false) {
    return;
  }
  if (action == 0) {
    if (0x52 < key) {
      if ((key != 0x53) && (key != 0x57)) {
        return;
      }
      (this->moveDelta).field_0.field_0.z = 0.0;
      return;
    }
    if ((key != 0x41) && (key != 0x44)) {
      return;
    }
    (this->moveDelta).field_0.field_0.x = 0.0;
    return;
  }
  if (action != 1) {
    return;
  }
  (*(this->super_Application)._vptr_Application[4])(this,(ulong)(uint)key);
  if ((mods & 2U) == 0) {
    if (key < 0x53) {
      switch(key) {
      case 0x41:
        (this->moveDelta).field_0.field_0.x = -1.0;
        return;
      case 0x42:
      case 0x45:
        return;
      case 0x43:
        Camera::str_abi_cxx11_(&local_50,&this->camera);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
          return;
        }
        return;
      case 0x44:
        (this->moveDelta).field_0.field_0.x = 1.0;
        return;
      case 0x46:
        glfwDestroyWindow(this->window);
        pTVar7 = this;
        if (this->fullscreen == true) {
          this->width = this->window_width;
          this->height = this->window_height;
          window = createStandardWindow(this,this->window_width,this->window_height);
        }
        else {
          this->window_width = this->width;
          this->window_height = this->height;
          window = createFullScreenWindow(this);
        }
        this->window = window;
        setCallbackFunctions(pTVar7,window);
        glfwMakeContextCurrent(this->window);
        this->fullscreen = (bool)(this->fullscreen ^ 1);
        return;
      }
      if (key == 0x20) {
        this_00 = (ImageT<embree::Col4<unsigned_char>_> *)operator_new(0x48);
        uVar2 = this->width;
        uVar3 = this->height;
        color = (Col4<unsigned_char> *)this->pixels;
        paVar1 = &local_50.field_2;
        local_50._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
        ImageT<embree::Col4<unsigned_char>_>::ImageT
                  (this_00,(ulong)uVar2,(ulong)uVar3,color,true,&local_50,true);
        local_58.ptr = (Image *)this_00;
        (*(this_00->super_Image).super_RefCount._vptr_RefCount[2])(this_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        FileName::FileName((FileName *)&local_50,"screenshot.tga");
        storeImage(&local_58,(FileName *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((ImageT<embree::Col4<unsigned_char>_> *)local_58.ptr !=
            (ImageT<embree::Col4<unsigned_char>_> *)0x0) {
          (*(((Image *)&(local_58.ptr)->super_RefCount)->super_RefCount)._vptr_RefCount[3])();
          return;
        }
        return;
      }
      if (key != 0x51) {
        return;
      }
switchD_0012634f_caseD_100:
      glfwSetWindowShouldClose(this->window,1);
      return;
    }
    switch(key) {
    case 0x100:
      goto switchD_0012634f_caseD_100;
    case 0x101:
    case 0x102:
    case 0x103:
    case 0x104:
    case 0x105:
      goto switchD_0012634f_caseD_101;
    case 0x106:
      fVar8 = 0.02;
      goto LAB_001266c1;
    case 0x107:
      fVar8 = -0.02;
LAB_001266c1:
      Camera::rotate(&this->camera,fVar8,0.0);
      return;
    case 0x108:
      fVar8 = -this->speed;
      goto LAB_001266e9;
    case 0x109:
      fVar8 = this->speed;
LAB_001266e9:
      Camera::move(&this->camera,0.0,0.0,fVar8);
      return;
    case 0x10a:
      fVar8 = this->speed * 1.2;
      break;
    case 0x10b:
      fVar8 = this->speed / 1.2;
      break;
    case 0x10c:
      fVar8 = g_debug + 0.01;
      goto LAB_00126744;
    case 0x10d:
      fVar8 = g_debug + -0.01;
LAB_00126744:
      if (1.0 <= fVar8) {
        fVar8 = 1.0;
      }
      g_debug = 0.0;
      if (0.0 <= fVar8) {
        g_debug = fVar8;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"g_debug",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
      poVar5 = std::ostream::_M_insert<double>((double)g_debug);
      goto LAB_001264b5;
    default:
      if (key == 0x53) {
        (this->moveDelta).field_0.field_0.z = -1.0;
        return;
      }
      if (key != 0x57) {
        return;
      }
      (this->moveDelta).field_0.field_0.z = 1.0;
      return;
    }
    this->speed = fVar8;
switchD_0012634f_caseD_101:
    return;
  }
  switch(key) {
  case 0x106:
    iVar6 = this->debug_int1 + 1;
    break;
  case 0x107:
    iVar6 = this->debug_int1 + -1;
    break;
  case 0x108:
    iVar6 = this->debug_int0 + -1;
    goto LAB_00126413;
  case 0x109:
    iVar6 = this->debug_int0 + 1;
LAB_00126413:
    this->debug_int0 = iVar6;
    rtcSetDeviceProperty(0,1000000);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"debug_int0",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
    iVar6 = this->debug_int0;
    goto LAB_001264ad;
  default:
    goto switchD_0012634f_caseD_101;
  }
  this->debug_int1 = iVar6;
  rtcSetDeviceProperty(0,0xf4241);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"debug_int1",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  iVar6 = this->debug_int1;
LAB_001264ad:
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar6);
LAB_001264b5:
  std::endl<char,std::char_traits<char>>(poVar5);
  return;
}

Assistant:

void TutorialApplication::keyboardFunc(GLFWwindow* window_in, int key, int scancode, int action, int mods)
  {
    ImGui_ImplGlfw_KeyCallback(window_in,key,scancode,action,mods);
    if (ImGui::GetIO().WantCaptureKeyboard) return;
      
    if (action == GLFW_PRESS)
    {
      /* call tutorial keyboard handler */
      keypressed(key);

      if (mods & GLFW_MOD_CONTROL)
      {
        switch (key) {
        case GLFW_KEY_UP        : debug_int0++; set_parameter(1000000,debug_int0); PRINT(debug_int0); break;
        case GLFW_KEY_DOWN      : debug_int0--; set_parameter(1000000,debug_int0); PRINT(debug_int0); break;
        case GLFW_KEY_LEFT      : debug_int1--; set_parameter(1000001,debug_int1); PRINT(debug_int1); break;
        case GLFW_KEY_RIGHT     : debug_int1++; set_parameter(1000001,debug_int1); PRINT(debug_int1); break;
        }
      }
      else
      {
        switch (key) {
        case GLFW_KEY_LEFT      : camera.rotate(-0.02f,0.0f); break;
        case GLFW_KEY_RIGHT     : camera.rotate(+0.02f,0.0f); break;
        case GLFW_KEY_UP        : camera.move(0.0f,0.0f,+speed); break;
        case GLFW_KEY_DOWN      : camera.move(0.0f,0.0f,-speed); break;
        case GLFW_KEY_PAGE_UP   : speed *= 1.2f; break;
        case GLFW_KEY_PAGE_DOWN : speed /= 1.2f; break;

        case GLFW_KEY_W : moveDelta.z = +1.0f; break;
        case GLFW_KEY_S : moveDelta.z = -1.0f; break;
        case GLFW_KEY_A : moveDelta.x = -1.0f; break;
        case GLFW_KEY_D : moveDelta.x = +1.0f; break;
          
        case GLFW_KEY_F :
          glfwDestroyWindow(window);
          if (fullscreen) {
            width = window_width;
            height = window_height;
            window = createStandardWindow(width,height);
            setCallbackFunctions(window);
          }
          else {
            window_width = width;
            window_height = height;
            window = createFullScreenWindow();
            setCallbackFunctions(window);
          }
          glfwMakeContextCurrent(window);
          fullscreen = !fullscreen;
          break;
          
        case GLFW_KEY_C : std::cout << camera.str() << std::endl; break;
        case GLFW_KEY_HOME: g_debug=clamp(g_debug+0.01f); PRINT(g_debug); break;
        case GLFW_KEY_END : g_debug=clamp(g_debug-0.01f); PRINT(g_debug); break;
          
        case GLFW_KEY_SPACE: {
          Ref<Image> image = new Image4uc(width, height, (Col4uc*)pixels, true, "", true);
          storeImage(image, "screenshot.tga");
          break;
        }
          
        case GLFW_KEY_ESCAPE:
        case GLFW_KEY_Q: 
          glfwSetWindowShouldClose(window,1);
          break;
        }
      }
    }
    else if (action == GLFW_RELEASE)
    {
      switch (key)
      {
      case GLFW_KEY_W : moveDelta.z = 0.0f; break;
      case GLFW_KEY_S : moveDelta.z = 0.0f; break;
      case GLFW_KEY_A : moveDelta.x = 0.0f; break;
      case GLFW_KEY_D : moveDelta.x = 0.0f; break;
      }
    }
  }